

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_authenticate
                   (connectdata *conn,char *mech,char *initresp,imapstate state1,imapstate state2)

{
  CURLcode local_2c;
  CURLcode result;
  imapstate state2_local;
  imapstate state1_local;
  char *initresp_local;
  char *mech_local;
  connectdata *conn_local;
  
  if (initresp == (char *)0x0) {
    local_2c = imap_sendf(conn,"AUTHENTICATE %s",mech);
    if (local_2c == CURLE_OK) {
      state(conn,state1);
    }
  }
  else {
    local_2c = imap_sendf(conn,"AUTHENTICATE %s %s",mech,initresp);
    if (local_2c == CURLE_OK) {
      state(conn,state2);
    }
  }
  return local_2c;
}

Assistant:

static CURLcode imap_perform_authenticate(struct connectdata *conn,
                                          const char *mech,
                                          const char *initresp,
                                          imapstate state1, imapstate state2)
{
  CURLcode result = CURLE_OK;

  if(initresp) {
    /* Send the AUTHENTICATE command with the initial response */
    result = imap_sendf(conn, "AUTHENTICATE %s %s", mech, initresp);

    if(!result)
      state(conn, state2);
  }
  else {
    /* Send the AUTHENTICATE command */
    result = imap_sendf(conn, "AUTHENTICATE %s", mech);

    if(!result)
      state(conn, state1);
  }

  return result;
}